

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O3

bool __thiscall State::isFinished(State *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar2 = (ulong)this->height;
  if (0 < (long)uVar2) {
    uVar1 = this->width;
    uVar4 = 0;
    lVar3 = 1;
    bVar6 = false;
    do {
      if (0 < (int)uVar1) {
        uVar5 = 0;
        do {
          if (((int)lVar3 - this->size) + (int)uVar5 == 0) {
            if (this->tiles[uVar4][uVar5] != 0) {
              return bVar6;
            }
          }
          else if ((int)lVar3 + (int)uVar5 != this->tiles[uVar4][uVar5]) {
            return bVar6;
          }
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
      uVar4 = uVar4 + 1;
      bVar6 = uVar2 <= uVar4;
      lVar3 = lVar3 + (ulong)uVar1;
    } while (uVar4 != uVar2);
  }
  return true;
}

Assistant:

bool State::isFinished() {
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            int expected = 1 + i * width + j;
            int actual = tiles[i][j];

            if (expected == size) {
                if (actual != 0) {
                    return false;
                }
            } else {
                if (actual != expected) {
                    return false;
                }
            }
        }
    }
    return true;
}